

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorScriptReference::DescriptorScriptReference(DescriptorScriptReference *this)

{
  this->script_type_ = kDescriptorScriptNull;
  Script::Script(&this->locking_script_);
  this->is_script_ = false;
  Script::Script(&this->redeem_script_);
  core::Address::Address(&this->address_script_);
  TapBranch::TapBranch(&this->tapbranch_);
  this->is_tapbranch_ = false;
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys_).
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

DescriptorScriptReference::DescriptorScriptReference()
    : script_type_(DescriptorScriptType::kDescriptorScriptNull),
      is_script_(false),
      is_tapbranch_(false) {
  // do nothing
}